

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodecTests.cc
# Opt level: O0

void avro::parsing::testCodec<avro::parsing::BinaryEncoderResolvingDecoderFactory>(TestData *td)

{
  basic_wrap_stringstream<char> *file;
  basic_wrap_stringstream<char> *line_num;
  basic_wrap_stringstream<char> *msg;
  basic_wrap_stringstream<char> *s;
  long in_RDI;
  auto_ptr<avro::InputStream> in;
  uint skipLevel;
  uint i_1;
  auto_ptr<avro::OutputStream> p;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  v;
  uint i;
  ValidSchema vs;
  ValidSchema *in_stack_fffffffffffffd58;
  basic_wrap_stringstream<char> *in_stack_fffffffffffffd60;
  basic_wrap_stringstream<char> *in_stack_fffffffffffffd70;
  basic_wrap_stringstream<char> *in_stack_fffffffffffffd78;
  basic_wrap_stringstream<char> *in_stack_fffffffffffffd80;
  basic_wrap_stringstream<char> *in_stack_fffffffffffffd88;
  basic_wrap_stringstream<char> *in_stack_fffffffffffffd90;
  unit_test_log_t *this;
  OutputStream local_230 [15];
  undefined1 local_221;
  unit_test_log_t local_220 [43];
  char *in_stack_ffffffffffffff38;
  basic_cstring<const_char> local_78;
  int local_64;
  uint local_60;
  auto_ptr<avro::OutputStream> local_40 [4];
  uint local_1c;
  long local_8;
  
  testCodec<avro::parsing::BinaryEncoderResolvingDecoderFactory>::testNo =
       testCodec<avro::parsing::BinaryEncoderResolvingDecoderFactory>::testNo + 1;
  local_8 = in_RDI;
  makeValidSchema(in_stack_ffffffffffffff38);
  for (local_1c = 0; local_1c < 10; local_1c = local_1c + 1) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)0x2529c2);
    std::auto_ptr<avro::OutputStream>::auto_ptr(local_40,(element_type *)0x0);
    BinaryEncoderFactory::newEncoder(in_stack_fffffffffffffd58);
    testEncoder((EncoderPtr *)in_stack_fffffffffffffd90,(char *)in_stack_fffffffffffffd88,
                (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_fffffffffffffd80,
                (auto_ptr<avro::OutputStream> *)in_stack_fffffffffffffd78);
    boost::shared_ptr<avro::Encoder>::~shared_ptr((shared_ptr<avro::Encoder> *)0x252a22);
    for (local_60 = 0; local_60 <= *(uint *)(local_8 + 0x10); local_60 = local_60 + 1) {
      local_64 = *(int *)(local_8 + 0x10) - local_60;
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                (&local_78,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/CodecTests.cc"
                 ,0x6d);
      this = local_220;
      memset(this,0,0x198);
      boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(in_stack_fffffffffffffd60);
      boost::basic_wrap_stringstream<char>::ref((basic_wrap_stringstream<char> *)local_220);
      file = boost::operator<<(in_stack_fffffffffffffd60,(char (*) [7])in_stack_fffffffffffffd58);
      line_num = boost::operator<<(in_stack_fffffffffffffd60,(int *)in_stack_fffffffffffffd58);
      local_221 = 0x20;
      msg = boost::operator<<(in_stack_fffffffffffffd60,(char *)in_stack_fffffffffffffd58);
      in_stack_fffffffffffffd90 =
           boost::operator<<(in_stack_fffffffffffffd60,(char (*) [10])in_stack_fffffffffffffd58);
      in_stack_fffffffffffffd88 =
           boost::operator<<(in_stack_fffffffffffffd60,(char **)in_stack_fffffffffffffd58);
      in_stack_fffffffffffffd80 =
           boost::operator<<(in_stack_fffffffffffffd60,(char (*) [9])in_stack_fffffffffffffd58);
      in_stack_fffffffffffffd78 =
           boost::operator<<(in_stack_fffffffffffffd60,(char **)in_stack_fffffffffffffd58);
      in_stack_fffffffffffffd70 =
           boost::operator<<(in_stack_fffffffffffffd60,(char (*) [14])in_stack_fffffffffffffd58);
      s = boost::operator<<(in_stack_fffffffffffffd60,(uint *)in_stack_fffffffffffffd58);
      in_stack_fffffffffffffd60 =
           (basic_wrap_stringstream<char> *)
           boost::basic_wrap_stringstream<char>::str_abi_cxx11_(in_stack_fffffffffffffd80);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_fffffffffffffd70,(std_string *)s);
      boost::unit_test::unit_test_log_t::set_checkpoint
                (this,(const_string *)file,(size_t)line_num,(const_string *)msg);
      boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(in_stack_fffffffffffffd60);
      std::auto_ptr<avro::OutputStream>::operator*(local_40);
      avro::memoryInputStream(local_230);
      BinaryEncoderResolvingDecoderFactory::newDecoder((ValidSchema *)file);
      std::auto_ptr<avro::InputStream>::operator*((auto_ptr<avro::InputStream> *)local_230);
      testDecoder((DecoderPtr *)in_stack_fffffffffffffd70,
                  (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)s,(InputStream *)in_stack_fffffffffffffd60,(char *)in_stack_fffffffffffffd58,0)
      ;
      boost::shared_ptr<avro::Decoder>::~shared_ptr((shared_ptr<avro::Decoder> *)0x252c61);
      std::auto_ptr<avro::InputStream>::~auto_ptr
                ((auto_ptr<avro::InputStream> *)in_stack_fffffffffffffd60);
    }
    std::auto_ptr<avro::OutputStream>::~auto_ptr
              ((auto_ptr<avro::OutputStream> *)in_stack_fffffffffffffd60);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_stack_fffffffffffffd70);
  }
  ValidSchema::~ValidSchema((ValidSchema *)0x252d89);
  return;
}

Assistant:

void testCodec(const TestData& td) {
    static int testNo = 0;
    testNo++;

    ValidSchema vs = makeValidSchema(td.schema);

    for (unsigned int i = 0; i < count; ++i) {
        vector<string> v;
        auto_ptr<OutputStream> p;
        testEncoder(CodecFactory::newEncoder(vs), td.calls, v, p);
        // dump(*p);

        for (unsigned int i = 0; i <= td.depth; ++i) {
            unsigned int skipLevel = td.depth - i;
            /*
            std::cout << "Test: " << testNo << ' '
                << " schema: " << td.schema
                << " calls: " << td.calls
                << " skip-level: " << skipLevel << std::endl;
                */
            BOOST_TEST_CHECKPOINT("Test: " << testNo << ' '
                << " schema: " << td.schema
                << " calls: " << td.calls
                << " skip-level: " << skipLevel);
            auto_ptr<InputStream> in = memoryInputStream(*p);
            testDecoder(CodecFactory::newDecoder(vs), v, *in,
                td.calls, skipLevel);
        }
    }
}